

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctionsGPU<double>
          (TasmanianSparseGrid *this,double *gpu_x,int cpu_num_x,int **gpu_pntr,int **gpu_indx,
          double **gpu_vals,int *num_nz)

{
  bool bVar1;
  runtime_error *prVar2;
  pointer pAVar3;
  double *pdVar4;
  GridLocalPolynomial *this_00;
  size_t sVar5;
  int *piVar6;
  undefined1 local_90 [8];
  GpuVector<double> vec_vals;
  GpuVector<int> vec_indx;
  GpuVector<int> vec_pntr;
  double *gpu_canonical_x;
  GpuVector<double> gpu_temp_x;
  double **gpu_vals_local;
  int **gpu_indx_local;
  int **gpu_pntr_local;
  int cpu_num_x_local;
  double *gpu_x_local;
  TasmanianSparseGrid *this_local;
  
  bVar1 = AccelerationMeta::isAvailable(accel_gpu_cuda);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar2,
               "ERROR: evaluateSparseHierarchicalFunctionsGPU() called, but the library was not compiled without Tasmanian_ENABLE_CUDA=ON and Tasmanian_ENABLE_HIP=ON"
              );
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = isLocalPolynomial(this);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar2,
               "ERROR: evaluateSparseHierarchicalFunctionsGPU() is allowed only for local polynomial grid."
              );
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pAVar3 = ::std::
           unique_ptr<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
           ::operator->(&this->acceleration);
  bVar1 = AccelerationContext::on_gpu(pAVar3);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar2,
               "ERROR: evaluateSparseHierarchicalFunctionsGPU() requires that a cuda gpu acceleration is enabled."
              );
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pAVar3 = ::std::
           unique_ptr<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
           ::operator->(&this->acceleration);
  AccelerationContext::setDevice(pAVar3);
  GpuVector<double>::GpuVector((GpuVector<double> *)&gpu_canonical_x);
  pdVar4 = formCanonicalPointsGPU<double>
                     (this,gpu_x,cpu_num_x,(GpuVector<double> *)&gpu_canonical_x);
  GpuVector<int>::GpuVector((GpuVector<int> *)&vec_indx.gpu_data);
  GpuVector<int>::GpuVector((GpuVector<int> *)&vec_vals.gpu_data);
  GpuVector<double>::GpuVector((GpuVector<double> *)local_90);
  this_00 = get<TasGrid::GridLocalPolynomial>(this);
  GridLocalPolynomial::buildSparseBasisMatrixGPU
            (this_00,pdVar4,cpu_num_x,(GpuVector<int> *)&vec_indx.gpu_data,
             (GpuVector<int> *)&vec_vals.gpu_data,(GpuVector<double> *)local_90);
  sVar5 = GpuVector<int>::size((GpuVector<int> *)&vec_vals.gpu_data);
  *num_nz = (int)sVar5;
  piVar6 = GpuVector<int>::eject((GpuVector<int> *)&vec_indx.gpu_data);
  *gpu_pntr = piVar6;
  piVar6 = GpuVector<int>::eject((GpuVector<int> *)&vec_vals.gpu_data);
  *gpu_indx = piVar6;
  pdVar4 = GpuVector<double>::eject((GpuVector<double> *)local_90);
  *gpu_vals = pdVar4;
  GpuVector<double>::~GpuVector((GpuVector<double> *)local_90);
  GpuVector<int>::~GpuVector((GpuVector<int> *)&vec_vals.gpu_data);
  GpuVector<int>::~GpuVector((GpuVector<int> *)&vec_indx.gpu_data);
  GpuVector<double>::~GpuVector((GpuVector<double> *)&gpu_canonical_x);
  return;
}

Assistant:

void TasmanianSparseGrid::evaluateSparseHierarchicalFunctionsGPU(const T gpu_x[], int cpu_num_x, int* &gpu_pntr, int* &gpu_indx, T* &gpu_vals, int &num_nz) const{
    if (not AccelerationMeta::isAvailable(accel_gpu_cuda))
        throw std::runtime_error("ERROR: evaluateSparseHierarchicalFunctionsGPU() called, but the library was not compiled without Tasmanian_ENABLE_CUDA=ON and Tasmanian_ENABLE_HIP=ON");
    if (!isLocalPolynomial()) throw std::runtime_error("ERROR: evaluateSparseHierarchicalFunctionsGPU() is allowed only for local polynomial grid.");
    if (not acceleration->on_gpu()) throw std::runtime_error("ERROR: evaluateSparseHierarchicalFunctionsGPU() requires that a cuda gpu acceleration is enabled.");
    acceleration->setDevice();
    GpuVector<T> gpu_temp_x;
    const T *gpu_canonical_x = formCanonicalPointsGPU(gpu_x, cpu_num_x, gpu_temp_x);
    GpuVector<int> vec_pntr, vec_indx;
    GpuVector<T> vec_vals;
    get<GridLocalPolynomial>()->buildSparseBasisMatrixGPU(gpu_canonical_x, cpu_num_x, vec_pntr, vec_indx, vec_vals);
    num_nz = (int) vec_indx.size();
    gpu_pntr = vec_pntr.eject();
    gpu_indx = vec_indx.eject();
    gpu_vals = vec_vals.eject();
}